

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void __thiscall xLearn::AUCMetric::~AUCMetric(AUCMetric *this)

{
  AUCMetric *in_RDI;
  
  ~AUCMetric(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

~AUCMetric() { }